

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

char * nifti_strdup(char *str)

{
  size_t sVar1;
  char *pcVar2;
  
  if (str != (char *)0x0) {
    sVar1 = strlen(str);
    pcVar2 = (char *)malloc(sVar1 + 1);
    if (pcVar2 != (char *)0x0) {
      pcVar2 = strcpy(pcVar2,str);
      return pcVar2;
    }
    fprintf(_stderr,"** nifti_strdup: failed to alloc %u bytes\n",(ulong)((int)sVar1 + 1));
  }
  return (char *)0x0;
}

Assistant:

char *nifti_strdup(const char *str)
{
  char *dup;

  if( !str ) return NULL;       /* allow calls passing NULL */

  dup = (char *)malloc(strlen(str) + 1);

  /* check for failure */
  if( dup ) strcpy(dup, str);
  else      fprintf(stderr,"** nifti_strdup: failed to alloc %u bytes\n",
                    (unsigned int)strlen(str)+1);

  return dup;
}